

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iwmmxt_helper.c
# Opt level: O0

uint64_t helper_iwmmxt_bcstb_aarch64(uint32_t arg)

{
  uint uVar1;
  uint32_t arg_local;
  
  uVar1 = arg & 0xff;
  return (ulong)uVar1 | (ulong)uVar1 << 8 | (ulong)uVar1 << 0x10 | (ulong)uVar1 << 0x18 |
         (ulong)uVar1 << 0x20 | (ulong)uVar1 << 0x28 | (ulong)uVar1 << 0x30 | (ulong)uVar1 << 0x38;
}

Assistant:

uint64_t HELPER(iwmmxt_bcstb)(uint32_t arg)
{
    arg &= 0xff;
    return
        ((uint64_t) arg << 0 ) | ((uint64_t) arg << 8 ) |
        ((uint64_t) arg << 16) | ((uint64_t) arg << 24) |
        ((uint64_t) arg << 32) | ((uint64_t) arg << 40) |
        ((uint64_t) arg << 48) | ((uint64_t) arg << 56);
}